

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O0

void arm_cpu_do_unaligned_access_arm
               (CPUState *cs,vaddr vaddr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  undefined1 local_44 [8];
  ARMMMUFaultInfo fi;
  ARMCPU *cpu;
  uintptr_t retaddr_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  vaddr vaddr_local;
  CPUState *cs_local;
  
  fi._12_8_ = cs;
  memset(local_44,0,0x14);
  cpu_restore_state_arm(cs,retaddr,true);
  local_44._0_4_ = ARMFault_Alignment;
  arm_deliver_fault((ARMCPU *)fi._12_8_,vaddr,access_type,mmu_idx,(ARMMMUFaultInfo *)local_44);
}

Assistant:

void arm_cpu_do_unaligned_access(CPUState *cs, vaddr vaddr,
                                 MMUAccessType access_type,
                                 int mmu_idx, uintptr_t retaddr)
{
    ARMCPU *cpu = ARM_CPU(cs);
    ARMMMUFaultInfo fi = { 0 };

    /* now we have a real cpu fault */
    cpu_restore_state(cs, retaddr, true);

    fi.type = ARMFault_Alignment;
    arm_deliver_fault(cpu, vaddr, access_type, mmu_idx, &fi);
}